

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

StringToInt64Map * __thiscall
CoreML::Specification::StringToInt64Map::New(StringToInt64Map *this,Arena *arena)

{
  StringToInt64Map *this_00;
  
  this_00 = (StringToInt64Map *)operator_new(0x38);
  StringToInt64Map(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::StringToInt64Map>(arena,this_00);
  }
  return this_00;
}

Assistant:

StringToInt64Map* StringToInt64Map::New(::google::protobuf::Arena* arena) const {
  StringToInt64Map* n = new StringToInt64Map;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}